

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  int *piVar1;
  ImDrawCmd *pIVar2;
  float *in_RSI;
  long in_RDI;
  ImDrawCmd *cmd;
  int cmd_i;
  ImDrawList *cmd_list;
  int i;
  ImVector<ImDrawCmd> *in_stack_ffffffffffffffc0;
  float local_38;
  float fStack_34;
  int local_24;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    piVar1 = *(int **)(*(long *)(in_RDI + 0x10) + (long)local_14 * 8);
    for (local_24 = 0; local_24 < *piVar1; local_24 = local_24 + 1) {
      pIVar2 = ImVector<ImDrawCmd>::operator[]
                         (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
      ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffc0,(pIVar2->ClipRect).x * *in_RSI,
                     (pIVar2->ClipRect).y * in_RSI[1],(pIVar2->ClipRect).z * *in_RSI,
                     (pIVar2->ClipRect).w * in_RSI[1]);
      *(ImVector<ImDrawCmd> **)&pIVar2->ClipRect = in_stack_ffffffffffffffc0;
      (pIVar2->ClipRect).z = local_38;
      (pIVar2->ClipRect).w = fStack_34;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}